

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O1

uint32_t FAudioSourceVoice_SubmitSourceBuffer
                   (FAudioSourceVoice *voice,FAudioBuffer *pBuffer,FAudioBufferWMA *pBufferWMA)

{
  ushort uVar1;
  uint uVar2;
  FAudioWaveFormatEx *pFVar3;
  FAudioBufferEntry *pFVar4;
  FAudioBufferEntry *pFVar5;
  FAudioBufferEntry *pFVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  FAudioADPCMWaveFormat *fmtex;
  uint uVar10;
  uint32_t uVar11;
  
  uVar7 = pBuffer->PlayBegin;
  uVar11 = pBuffer->PlayLength;
  uVar2 = pBuffer->LoopBegin;
  uVar8 = pBuffer->LoopLength;
  if ((pBuffer->LoopCount == 0) && (uVar2 != 0 || uVar8 != 0)) {
    return 0x88960001;
  }
  if (uVar11 == 0) {
    pFVar3 = (voice->field_19).src.format;
    if (pFVar3->wFormatTag == 0x166) {
      uVar10 = *(uint *)((long)&pFVar3[1].nSamplesPerSec + 2);
    }
    else if (pFVar3->wFormatTag == 2) {
      uVar10 = (uint)pFVar3[1].wFormatTag * (pBuffer->AudioBytes / (uint)pFVar3->nBlockAlign);
    }
    else {
      if (pBufferWMA == (FAudioBufferWMA *)0x0) {
        uVar10 = pBuffer->AudioBytes;
        uVar9 = (uint)pFVar3->nBlockAlign;
      }
      else {
        uVar10 = pBufferWMA->pDecodedPacketCumulativeBytes[pBufferWMA->PacketCount - 1];
        uVar9 = (uint)pFVar3->wBitsPerSample * (uint)pFVar3->nChannels >> 3;
      }
      uVar10 = uVar10 / uVar9;
    }
    uVar11 = uVar10 - uVar7;
  }
  if ((pBufferWMA == (FAudioBufferWMA *)0x0 && pBuffer->LoopCount != 0) &&
     (((voice->field_19).src.format)->wFormatTag != 0x166)) {
    uVar10 = uVar11 + uVar7;
    if (uVar10 < uVar2 || uVar10 - uVar2 == 0) {
      return 0x88960001;
    }
    uVar9 = uVar10 - uVar2;
    if (uVar8 != 0) {
      uVar9 = uVar8;
    }
    uVar8 = uVar9;
    if (7 < voice->audio->version) {
      if (uVar2 + uVar9 <= uVar7) {
        return 0x88960001;
      }
      if (uVar10 < uVar2 + uVar9) {
        return 0x88960001;
      }
    }
  }
  pFVar3 = (voice->field_19).src.format;
  if (pFVar3->wFormatTag == 2) {
    uVar1 = pFVar3[1].wFormatTag;
    uVar7 = uVar7 - uVar7 % (uint)uVar1;
    uVar11 = uVar11 - uVar11 % (uint)uVar1;
    pBuffer->AudioBytes = pBuffer->AudioBytes - pBuffer->AudioBytes % (uint)pFVar3->nBlockAlign;
    uVar8 = uVar8 - uVar8 % (uint)uVar1;
    uVar2 = uVar2 - uVar2 % (uint)uVar1;
  }
  else if (pFVar3->wFormatTag == 0x166 || pBufferWMA != (FAudioBufferWMA *)0x0) {
    uVar8 = uVar11 + uVar7;
    uVar2 = 0;
  }
  pFVar5 = (FAudioBufferEntry *)(*voice->audio->pMalloc)(0x40);
  SDL_memcpy(pFVar5,pBuffer,0x2c);
  (pFVar5->buffer).PlayBegin = uVar7;
  (pFVar5->buffer).PlayLength = uVar11;
  (pFVar5->buffer).LoopBegin = uVar2;
  (pFVar5->buffer).LoopLength = uVar8;
  if (pBufferWMA != (FAudioBufferWMA *)0x0) {
    SDL_memcpy(&pFVar5->bufferWMA,pBufferWMA,0xc);
  }
  pFVar5->next = (FAudioBufferEntry *)0x0;
  if (((voice->audio->version < 8) && ((pFVar5->buffer).LoopCount != 0)) &&
     ((pFVar5->buffer).LoopLength + (pFVar5->buffer).LoopBegin <= (pFVar5->buffer).PlayBegin)) {
    (pFVar5->buffer).LoopCount = 0;
  }
  FAudio_PlatformLockMutex((voice->field_19).src.bufferLock);
  pFVar4 = (voice->field_19).src.bufferList;
  if (pFVar4 == (FAudioBufferEntry *)0x0) {
    (voice->field_19).src.bufferList = pFVar5;
    (voice->field_19).src.curBufferOffset = (pFVar5->buffer).PlayBegin;
    (voice->field_19).src.newBuffer = '\x01';
  }
  else {
    do {
      pFVar6 = pFVar4;
      pFVar4 = pFVar6->next;
    } while (pFVar4 != (FAudioBufferEntry *)0x0);
    pFVar6->next = pFVar5;
  }
  FAudio_PlatformUnlockMutex((voice->field_19).src.bufferLock);
  return 0;
}

Assistant:

uint32_t FAudioSourceVoice_SubmitSourceBuffer(
	FAudioSourceVoice *voice,
	const FAudioBuffer *pBuffer,
	const FAudioBufferWMA *pBufferWMA
) {
	uint32_t adpcmMask, *adpcmByteCount;
	uint32_t playBegin, playLength, loopBegin, loopLength;
	FAudioBufferEntry *entry, *list;

	LOG_API_ENTER(voice->audio)
	LOG_INFO(
		voice->audio,
		"%p: {Flags: 0x%x, AudioBytes: %u, pAudioData: %p, Play: %u + %u, Loop: %u + %u x %u}",
		(void*) voice,
		pBuffer->Flags,
		pBuffer->AudioBytes,
		(const void*) pBuffer->pAudioData,
		pBuffer->PlayBegin,
		pBuffer->PlayLength,
		pBuffer->LoopBegin,
		pBuffer->LoopLength,
		pBuffer->LoopCount
	)

	FAudio_assert(voice->type == FAUDIO_VOICE_SOURCE);
#ifdef HAVE_WMADEC
	FAudio_assert(	(voice->src.wmadec != NULL && (pBufferWMA != NULL ||
					(voice->src.format->wFormatTag == FAUDIO_FORMAT_XMAUDIO2 ||
					 voice->src.format->wFormatTag == FAUDIO_FORMAT_EXTENSIBLE))) ||
			(voice->src.wmadec == NULL && (pBufferWMA == NULL && voice->src.format->wFormatTag != FAUDIO_FORMAT_XMAUDIO2))	);
#endif /* HAVE_WMADEC */

	/* Start off with whatever they just sent us... */
	playBegin = pBuffer->PlayBegin;
	playLength = pBuffer->PlayLength;
	loopBegin = pBuffer->LoopBegin;
	loopLength = pBuffer->LoopLength;

	/* "LoopBegin/LoopLength must be zero if LoopCount is 0" */
	if (pBuffer->LoopCount == 0 && (loopBegin > 0 || loopLength > 0))
	{
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}

	/* PlayLength Default */
	if (playLength == 0)
	{
		if (voice->src.format->wFormatTag == FAUDIO_FORMAT_MSADPCM)
		{
			FAudioADPCMWaveFormat *fmtex = (FAudioADPCMWaveFormat*) voice->src.format;
			playLength = (
				pBuffer->AudioBytes /
				fmtex->wfx.nBlockAlign *
				fmtex->wSamplesPerBlock
			) - playBegin;
		}
		else if (voice->src.format->wFormatTag == FAUDIO_FORMAT_XMAUDIO2)
		{
			FAudioXMA2WaveFormat *fmtex = (FAudioXMA2WaveFormat*) voice->src.format;
			playLength = fmtex->dwSamplesEncoded - playBegin;
		}
		else if (pBufferWMA != NULL)
		{
			playLength = (
				pBufferWMA->pDecodedPacketCumulativeBytes[pBufferWMA->PacketCount - 1] /
				(voice->src.format->nChannels * voice->src.format->wBitsPerSample / 8)
			) - playBegin;
		}
		else
		{
			playLength = (
				pBuffer->AudioBytes /
				voice->src.format->nBlockAlign
			) - playBegin;
		}
	}

	if (pBuffer->LoopCount > 0 && pBufferWMA == NULL && voice->src.format->wFormatTag != FAUDIO_FORMAT_XMAUDIO2)
	{
		/* "The value of LoopBegin must be less than PlayBegin + PlayLength" */
		if (loopBegin >= (playBegin + playLength))
		{
			LOG_API_EXIT(voice->audio)
			return FAUDIO_E_INVALID_CALL;
		}

		/* LoopLength Default */
		if (loopLength == 0)
		{
			loopLength = playBegin + playLength - loopBegin;
		}

		/* "The value of LoopBegin + LoopLength must be greater than PlayBegin
		 * and less than PlayBegin + PlayLength"
		 */
		if (	voice->audio->version > 7 && (
			(loopBegin + loopLength) <= playBegin ||
			(loopBegin + loopLength) > (playBegin + playLength))	)
		{
			LOG_API_EXIT(voice->audio)
			return FAUDIO_E_INVALID_CALL;
		}
	}

	/* For ADPCM, round down to the nearest sample block size */
	if (voice->src.format->wFormatTag == FAUDIO_FORMAT_MSADPCM)
	{
		adpcmMask = ((FAudioADPCMWaveFormat*) voice->src.format)->wSamplesPerBlock;
		playBegin -= playBegin % adpcmMask;
		playLength -= playLength % adpcmMask;
		loopBegin -= loopBegin % adpcmMask;
		loopLength -= loopLength % adpcmMask;

		/* This is basically a const_cast... */
		adpcmByteCount = (uint32_t*) &pBuffer->AudioBytes;
		*adpcmByteCount = (
			pBuffer->AudioBytes / voice->src.format->nBlockAlign
		) * voice->src.format->nBlockAlign;
	}
	else if (pBufferWMA != NULL || voice->src.format->wFormatTag == FAUDIO_FORMAT_XMAUDIO2)
	{
		/* WMA only supports looping the whole buffer */
		loopBegin = 0;
		loopLength = playBegin + playLength;
	}

	/* Allocate, now that we have valid input */
	entry = (FAudioBufferEntry*) voice->audio->pMalloc(sizeof(FAudioBufferEntry));
	FAudio_memcpy(&entry->buffer, pBuffer, sizeof(FAudioBuffer));
	entry->buffer.PlayBegin = playBegin;
	entry->buffer.PlayLength = playLength;
	entry->buffer.LoopBegin = loopBegin;
	entry->buffer.LoopLength = loopLength;
	if (pBufferWMA != NULL)
	{
		FAudio_memcpy(&entry->bufferWMA, pBufferWMA, sizeof(FAudioBufferWMA));
	}
	entry->next = NULL;

	if (	voice->audio->version <= 7 && (
		entry->buffer.LoopCount > 0 &&
		entry->buffer.LoopBegin + entry->buffer.LoopLength <= entry->buffer.PlayBegin))
	{
		entry->buffer.LoopCount = 0;
	}

#ifdef FAUDIO_DUMP_VOICES
	/* dumping current buffer, append into "data" section */
	if (pBuffer->pAudioData != NULL && playLength > 0)
	{
		FAudio_DUMPVOICE_WriteBuffer(voice, pBuffer, pBufferWMA, playBegin, playLength);
	}
#endif /* FAUDIO_DUMP_VOICES */

	/* Submit! */
	FAudio_PlatformLockMutex(voice->src.bufferLock);
	LOG_MUTEX_LOCK(voice->audio, voice->src.bufferLock)
	if (voice->src.bufferList == NULL)
	{
		voice->src.bufferList = entry;
		voice->src.curBufferOffset = entry->buffer.PlayBegin;
		voice->src.newBuffer = 1;
	}
	else
	{
		list = voice->src.bufferList;
		while (list->next != NULL)
		{
			list = list->next;
		}
		list->next = entry;

		/* For some bizarre reason we get scenarios where a buffer is freed, only to
		 * have the allocator give us the exact same address and somehow get a single
		 * buffer referencing itself. I don't even know.
		 */
		FAudio_assert(list != entry);
	}
	LOG_INFO(
		voice->audio,
		"%p: appended buffer %p",
		(void*) voice,
		(void*) &entry->buffer
	)
	FAudio_PlatformUnlockMutex(voice->src.bufferLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->src.bufferLock)
	LOG_API_EXIT(voice->audio)
	return 0;
}